

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

char * cmOutputConverter::Shell__SkipMakeVariables(char *c)

{
  char c_00;
  int iVar1;
  char *pcVar2;
  
  while( true ) {
    pcVar2 = c;
    if (*pcVar2 != '$') {
      return pcVar2;
    }
    if (pcVar2[1] != '(') break;
    c = pcVar2 + 2;
    do {
      c_00 = *c;
      iVar1 = Shell__CharIsMakeVariableName(c_00);
      c = c + 1;
    } while (iVar1 != 0);
    if (c_00 != ')') {
      return pcVar2;
    }
  }
  return pcVar2;
}

Assistant:

const char* cmOutputConverter::Shell__SkipMakeVariables(const char* c)
{
  while (*c == '$' && *(c + 1) == '(') {
    const char* skip = c + 2;
    while (Shell__CharIsMakeVariableName(*skip)) {
      ++skip;
    }
    if (*skip == ')') {
      c = skip + 1;
    } else {
      break;
    }
  }
  return c;
}